

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextGLImpl::PrepareForIndirectDrawCount
          (DeviceContextGLImpl *this,IBuffer *pCountBuffer)

{
  BufferGLImpl *this_00;
  bool ResetVAO;
  BufferGLImpl *pCountBufferGL;
  IBuffer *pCountBuffer_local;
  DeviceContextGLImpl *this_local;
  
  this_00 = ClassPtrCast<Diligent::BufferGLImpl,Diligent::IBuffer>(pCountBuffer);
  BufferGLImpl::BufferMemoryBarrier(this_00,MEMORY_BARRIER_INDIRECT_BUFFER,&this->m_ContextState);
  GLContextState::BindBuffer(&this->m_ContextState,0x80ee,&this_00->m_GlBuffer,false);
  return;
}

Assistant:

void DeviceContextGLImpl::PrepareForIndirectDrawCount(IBuffer* pCountBuffer)
{
#if GL_ARB_indirect_parameters
    BufferGLImpl* pCountBufferGL = ClassPtrCast<BufferGLImpl>(pCountBuffer);
    // The indirect rendering functions take their data from the buffer currently bound to the
    // GL_DRAW_INDIRECT_BUFFER binding. Thus, any of indirect draw functions will fail if no buffer is
    // bound to that binding.
    pCountBufferGL->BufferMemoryBarrier(
        MEMORY_BARRIER_INDIRECT_BUFFER, // Command data sourced from buffer objects by
                                        // Draw*Indirect and DispatchComputeIndirect commands after the barrier
                                        // will reflect data written by shaders prior to the barrier.The buffer
                                        // objects affected by this bit are derived from the DRAW_INDIRECT_BUFFER
                                        // and DISPATCH_INDIRECT_BUFFER bindings.
        m_ContextState);
    constexpr bool ResetVAO = false; // GL_DRAW_INDIRECT_BUFFER does not affect VAO
    m_ContextState.BindBuffer(GL_PARAMETER_BUFFER, pCountBufferGL->m_GlBuffer, ResetVAO);
#endif
}